

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QStyle * __thiscall QStyleSheetStyle::baseStyle(QStyleSheetStyle *this)

{
  QObject *object;
  QStyleSheetStyle *pQVar1;
  QStyle *pQVar2;
  
  pQVar2 = *(QStyle **)(this + 0x10);
  if (pQVar2 == (QStyle *)0x0) {
    object = &QApplication::style()->super_QObject;
    pQVar1 = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>(object);
    if (pQVar1 == (QStyleSheetStyle *)0x0) {
      pQVar2 = QApplication::style();
      return pQVar2;
    }
    pQVar2 = pQVar1->base;
  }
  return pQVar2;
}

Assistant:

QStyle *QStyleSheetStyle::baseStyle() const
{
    if (base)
        return base;
    if (QStyleSheetStyle *me = qt_styleSheet(QApplication::style()))
        return me->base;
    return QApplication::style();
}